

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liblocate.c
# Opt level: O3

void getBundlePath(char **path,uint *pathLength)

{
  uchar uVar1;
  char *executablePath;
  uint bundlePathLength;
  uint executablePathDirectoryLength;
  uint executablePathLength;
  char *local_48;
  uint local_3c;
  uint local_38;
  uint local_34;
  
  uVar1 = checkStringOutParameter(path,pathLength);
  if (uVar1 != '\0') {
    local_48 = (char *)0x0;
    local_34 = 0;
    getExecutablePath(&local_48,&local_34);
    local_38 = 0;
    getDirectoryPart(local_48,local_34,&local_38);
    unifyPathDelimiters(local_48,local_38);
    local_3c = 0;
    getBundlePart(local_48,local_38,&local_3c);
    if (local_3c == 0) {
      free(local_48);
      invalidateStringOutParameter(path,pathLength);
    }
    else {
      copyToStringOutParameter(local_48,local_3c,path,pathLength);
      free(local_48);
    }
  }
  return;
}

Assistant:

void getBundlePath(char ** path, unsigned int * pathLength)
{
    // Early exit when invalid out-parameters are passed
    if (!checkStringOutParameter(path, pathLength))
    {
        return;
    }

    // Get directory where the executable is located
    char * executablePath = 0x0;
    unsigned int executablePathLength = 0;
    getExecutablePath(&executablePath, &executablePathLength);

    // Extract directory part from executable path (without trailing slash)
    unsigned int executablePathDirectoryLength = 0;
    getDirectoryPart(executablePath, executablePathLength, &executablePathDirectoryLength);

    // Convert to canonical path
    unifyPathDelimiters(executablePath, executablePathDirectoryLength);

    // check for /Contents/MacOS
    unsigned int bundlePathLength = 0;
    getBundlePart(executablePath, executablePathDirectoryLength, &bundlePathLength);

    if (bundlePathLength == 0) // No bundle
    {
        free(executablePath);
        invalidateStringOutParameter(path, pathLength);
        return;
    }

    // Copy contents to caller, create caller ownership
    copyToStringOutParameter(executablePath, bundlePathLength, path, pathLength);

    free(executablePath);
}